

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToggleTiles.cpp
# Opt level: O2

void __thiscall commands::ToggleTiles::execute(ToggleTiles *this)

{
  pointer pTVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  Tile tile;
  
  Command::execute(&this->super_Command);
  lVar3 = 0;
  for (uVar2 = 0;
      pTVar1 = (this->toggleData_).
               super__Vector_base<commands::ToggleTiles::ToggleData,_std::allocator<commands::ToggleTiles::ToggleData>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(this->toggleData_).
                             super__Vector_base<commands::ToggleTiles::ToggleData,_std::allocator<commands::ToggleTiles::ToggleData>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0xc);
      uVar2 = uVar2 + 1) {
    Board::accessTile(&tile,this->board_,(Vector2i *)((long)&(pTVar1->pos).x + lVar3));
    Tile::setState(&tile,(&((this->toggleData_).
                            super__Vector_base<commands::ToggleTiles::ToggleData,_std::allocator<commands::ToggleTiles::ToggleData>_>
                            ._M_impl.super__Vector_impl_data._M_start)->newState)[lVar3]);
    if (this->highlightTiles_ == true) {
      Tile::setHighlight(&tile,true);
    }
    lVar3 = lVar3 + 0xc;
  }
  return;
}

Assistant:

void ToggleTiles::execute() {
    Command::execute();
    for (size_t i = 0; i < toggleData_.size(); ++i) {
        auto tile = board_.accessTile(toggleData_[i].pos);
        tile.setState(toggleData_[i].newState);
        if (highlightTiles_) {
            tile.setHighlight(true);
        }
    }
}